

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

void result_tests::check_returned_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  check_returned t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff608;
  std_string *in_stack_fffffffffffff610;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff618;
  const_string *in_stack_fffffffffffff630;
  const_string *msg;
  size_t in_stack_fffffffffffff638;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff640;
  unit_test_log_t *in_stack_fffffffffffff648;
  check_returned *in_stack_fffffffffffff670;
  undefined1 local_800 [408];
  undefined1 local_668 [408];
  undefined1 local_4d0 [408];
  undefined1 local_338 [408];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_338,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [16])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::setup_conditional<result_tests::check_returned>((check_returned *)0x97161d);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_4d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [13])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  check_returned::test_method(in_stack_fffffffffffff670);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [19])in_stack_fffffffffffff610);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::teardown_conditional<result_tests::check_returned>((check_returned *)0x971858);
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  __s = local_800;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  file = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  this_00 = boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)__s,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_returned)
{
    ExpectSuccess(IntFn(5, true), {}, 5);
    ExpectFail(IntFn(5, false), Untranslated("int 5 error."));
    ExpectSuccess(NoCopyFn(5, true), {}, 5);
    ExpectFail(NoCopyFn(5, false), Untranslated("nocopy 5 error."));
    ExpectSuccess(StrFn(Untranslated("S"), true), {}, Untranslated("S"));
    ExpectFail(StrFn(Untranslated("S"), false), Untranslated("str S error."));
}